

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

char * glfwGetGamepadName(int jid)

{
  int iVar1;
  _GLFWmapping *p_Var2;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/alifarazz[P]bezier_curve/build_O1/_deps/glfw-src/src/input.c"
                  ,0x4bf,"const char *glfwGetGamepadName(int)");
  }
  if (jid < 0x10) {
    if (_glfw.initialized == 0) {
      p_Var2 = (_GLFWmapping *)0x0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else if (_glfw.joysticks[(uint)jid].present == 0) {
      p_Var2 = (_GLFWmapping *)0x0;
    }
    else {
      p_Var2 = (_GLFWmapping *)0x0;
      iVar1 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,0);
      if (iVar1 != 0) {
        p_Var2 = _glfw.joysticks[(uint)jid].mapping;
      }
    }
    return p_Var2->name;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/alifarazz[P]bezier_curve/build_O1/_deps/glfw-src/src/input.c"
                ,0x4c0,"const char *glfwGetGamepadName(int)");
}

Assistant:

GLFWAPI const char* glfwGetGamepadName(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return NULL;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return NULL;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_PRESENCE))
        return NULL;

    if (!js->mapping)
        return NULL;

    return js->mapping->name;
}